

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O0

void __thiscall
so_5::disp::prio_one_thread::strictly_ordered::impl::
dispatcher_template_t<so_5::disp::prio_one_thread::reuse::work_thread_template_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t,_so_5::disp::prio_one_thread::reuse::work_thread_details::with_activity_tracking_impl_t>_>
::disp_data_source_t::distribute(disp_data_source_t *this,mbox_t *mbox)

{
  anon_class_24_3_9cd0e2e5 handler;
  size_t to;
  suffix_t local_40;
  disp_data_source_t *local_38;
  mbox_t *local_30;
  size_t *local_28;
  size_t local_20;
  size_t agents_count;
  mbox_t *mbox_local;
  disp_data_source_t *this_local;
  
  local_20 = 0;
  local_28 = &local_20;
  handler.mbox = mbox;
  handler.this = this;
  handler.agents_count = local_28;
  local_38 = this;
  local_30 = mbox;
  agents_count = (size_t)mbox;
  mbox_local = (mbox_t *)this;
  demand_queue_t::
  handle_stats_for_each_prio<so_5::disp::prio_one_thread::strictly_ordered::impl::dispatcher_template_t<so_5::disp::prio_one_thread::reuse::work_thread_template_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t,so_5::disp::prio_one_thread::reuse::work_thread_details::with_activity_tracking_impl_t>>::disp_data_source_t::distribute(so_5::intrusive_ptr_t<so_5::abstract_message_box_t>const&)::_lambda(so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t::queue_stats_t_const&)_1_>
            (&this->m_dispatcher->m_demand_queue,handler);
  to = agents_count;
  local_40 = stats::suffixes::agent_count();
  send<so_5::stats::messages::quantity<unsigned_long>,so_5::intrusive_ptr_t<so_5::abstract_message_box_t>const&,so_5::stats::prefix_t&,so_5::stats::suffix_t,unsigned_long&>
            ((intrusive_ptr_t<so_5::abstract_message_box_t> *)to,&this->m_base_prefix,&local_40,
             &local_20);
  anon_unknown_10::send_thread_activity_stats
            ((mbox_t *)agents_count,&this->m_base_prefix,&this->m_dispatcher->m_work_thread);
  return;
}

Assistant:

virtual void
				distribute( const mbox_t & mbox ) override
					{
						std::size_t agents_count = 0;

						m_dispatcher.m_demand_queue.handle_stats_for_each_prio(
							[&]( const demand_queue_t::queue_stats_t & stat ) {
								distribute_value_for_priority(
									mbox,
									stat.m_priority,
									stat.m_agents_count,
									stat.m_demands_count );

								agents_count += stat.m_agents_count;
							} );

						so_5::send< stats::messages::quantity< std::size_t > >(
								mbox,
								m_base_prefix,
								stats::suffixes::agent_count(),
								agents_count );

						send_thread_activity_stats(
								mbox,
								m_base_prefix,
								m_dispatcher.m_work_thread );
					}